

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Relation::Bind(BoundStatement *__return_storage_ptr__,Relation *this,Binder *binder)

{
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> uVar1;
  SelectStatement stmt;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_a0;
  SelectStatement local_98;
  
  SelectStatement::SelectStatement(&local_98);
  (*this->_vptr_Relation[3])(&local_a0,this);
  uVar1.super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
       (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
       (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)local_98.node;
  local_98.node.super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
       (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
       (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)local_a0._M_head_impl
  ;
  local_a0._M_head_impl = (QueryNode *)0x0;
  if (uVar1.super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true,_true>)0x0) {
    (**(code **)(*(long *)uVar1.
                          super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                          .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl + 8))();
    if (local_a0._M_head_impl != (QueryNode *)0x0) {
      (*(local_a0._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  Binder::Bind(__return_storage_ptr__,binder,&local_98.super_SQLStatement);
  SelectStatement::~SelectStatement(&local_98);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Relation::Bind(Binder &binder) {
	SelectStatement stmt;
	stmt.node = GetQueryNode();
	return binder.Bind(stmt.Cast<SQLStatement>());
}